

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O1

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
::swap(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
       *this,flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
             *other)

{
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  tmp;
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  local_40;
  
  local_40.buffer_.v1_._M_resource = (other->buffer_).v1_._M_resource;
  local_40.buffer_.v2_.begin = (pointer_type)0x0;
  local_40.buffer_.v2_.last = (pointer_type)0x0;
  local_40.buffer_.v2_.end = (pointer_type)0x0;
  clear(&local_40);
  local_40.buffer_.v2_.begin = (other->buffer_).v2_.begin;
  local_40.buffer_.v2_.end = (other->buffer_).v2_.end;
  local_40.buffer_.v2_.last = (other->buffer_).v2_.last;
  (other->buffer_).v2_.end = (pointer_type)0x0;
  (other->buffer_).v2_.begin = (pointer_type)0x0;
  (other->buffer_).v2_.last = (pointer_type)0x0;
  if (other != this) {
    try_move_from(other,this);
  }
  if (&local_40 != this) {
    try_move_from(this,&local_40);
  }
  clear(&local_40);
  return;
}

Assistant:

void swap(flat_forward_list &other) noexcept (allocator_type_traits::propagate_on_container_swap::value ||
                                                  allocator_type_traits::propagate_on_container_move_assignment::value) {
        if constexpr (allocator_type_traits::propagate_on_container_swap::value) {
            std::swap(get_allocator(), other.get_allocator());
            std::swap(buff().begin, other.buff().begin);
            std::swap(buff().end, other.buff().end);
            std::swap(buff().last, other.buff().last);
        } else {
            flat_forward_list tmp{ std::move(other) };
            other = std::move(*this);
            *this = std::move(tmp);
        }
    }